

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O1

int mcpl2phits_parse_args
              (int argc,char **argv,char **inmcplfile,char **outphitsfile,uint64_t *nparticles_limit
              ,int *use64bitreclen,int *nopolarisation)

{
  char *__s;
  long lVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  int unaff_EBP;
  uint64_t *puVar5;
  int *piVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  int64_t opt_num_limit;
  uint64_t local_58;
  char **local_50;
  char **local_48;
  uint64_t *local_40;
  int *local_38;
  
  *inmcplfile = (char *)0x0;
  *outphitsfile = (char *)0x0;
  *nparticles_limit = 0xffffffffffffffff;
  *use64bitreclen = 0;
  *nopolarisation = 0;
  local_58 = 0xffffffffffffffff;
  local_50 = inmcplfile;
  local_40 = nparticles_limit;
  local_38 = use64bitreclen;
  if (1 < argc) {
    uVar7 = 1;
    local_48 = outphitsfile;
    do {
      __s = argv[uVar7];
      sVar3 = strlen(__s);
      if (sVar3 == 0) {
        bVar8 = false;
      }
      else if (sVar3 == 1) {
LAB_001035bd:
        if ((*__s == '-') || (*outphitsfile != (char *)0x0)) {
          printf("ERROR: %s\n\n");
          puts("Run with -h or --help for usage information");
          unaff_EBP = 1;
          bVar8 = true;
        }
        else {
          if (*local_50 == (char *)0x0) {
            *local_50 = __s;
          }
          else {
            *outphitsfile = __s;
          }
          bVar8 = false;
        }
      }
      else if ((*__s == '-') && (__s[1] != '-')) {
        bVar8 = 1 < sVar3;
        outphitsfile = local_48;
        if (bVar8) {
          puVar5 = (uint64_t *)0x0;
          uVar4 = 2;
          do {
            if (puVar5 == (uint64_t *)0x0) {
              puVar5 = &local_58;
              piVar6 = local_38;
              switch(__s[uVar4 - 1]) {
              default:
                goto LAB_00103755;
              case 'h':
                mcpl2phits_app_usage(argv,(char *)0x0);
                unaff_EBP = -1;
                outphitsfile = local_48;
                goto LAB_0010360a;
              case 'n':
                piVar6 = nopolarisation;
              case 'f':
                *piVar6 = 1;
                puVar5 = (uint64_t *)0x0;
              case 'l':
                if (puVar5 == (uint64_t *)0x0) {
                  puVar5 = (uint64_t *)0x0;
                }
                else {
                  *puVar5 = 0;
                  if (uVar4 == sVar3) goto LAB_00103755;
                }
              }
            }
            else {
              if ((byte)(__s[uVar4 - 1] - 0x3aU) < 0xf6) {
LAB_00103755:
                printf("ERROR: %s\n\n");
                puts("Run with -h or --help for usage information");
                unaff_EBP = 1;
                outphitsfile = local_48;
                break;
              }
              lVar1 = *puVar5;
              *puVar5 = lVar1 * 10;
              *puVar5 = lVar1 * 10 + (long)__s[uVar4 - 1] + -0x30;
            }
            bVar8 = uVar4 < sVar3;
            bVar9 = uVar4 != sVar3;
            uVar4 = uVar4 + 1;
            outphitsfile = local_48;
          } while (bVar9);
        }
      }
      else {
        if ((sVar3 != 6) || (iVar2 = strcmp(__s,"--help"), iVar2 != 0)) goto LAB_001035bd;
        mcpl2phits_app_usage(argv,(char *)0x0);
        bVar8 = true;
        unaff_EBP = -1;
      }
LAB_0010360a:
      if (bVar8) {
        return unaff_EBP;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)argc);
  }
  if (*local_50 == (char *)0x0) {
    printf("ERROR: %s\n\n","Missing argument : input MCPL file");
    puts("Run with -h or --help for usage information");
    iVar2 = 1;
  }
  else {
    if (*outphitsfile == (char *)0x0) {
      *outphitsfile = "phits.dmp";
    }
    if ((long)local_58 < 1) {
      local_58 = 0;
    }
    *local_40 = local_58;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mcpl2phits_parse_args( int argc,const char **argv, const char** inmcplfile,
                           const char **outphitsfile, uint64_t* nparticles_limit,
                           int* use64bitreclen, int* nopolarisation ) {
  //returns: 0 all ok, 1: error, -1: all ok but do nothing (-h/--help mode)
  *inmcplfile = 0;
  *outphitsfile = 0;
  *nparticles_limit = UINT64_MAX;
  *use64bitreclen = 0;
  *nopolarisation = 0;

  int64_t opt_num_limit = -1;
  int i;
  for (i = 1; i<argc; ++i) {
    const char * a = argv[i];
    size_t n = strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = 0;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9')
            return mcpl2phits_app_usage(argv,"Bad option: expected number");
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        switch(a[j]) {
        case 'h': mcpl2phits_app_usage(argv,0); return -1;
        case 'l': consume_digit = &opt_num_limit; break;
        case 'f': *use64bitreclen = 1; break;
        case 'n': *nopolarisation = 1; break;
        default:
          return mcpl2phits_app_usage(argv,"Unrecognised option");
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n)
            return mcpl2phits_app_usage(argv,"Bad option: missing number");
        }
      }

    } else if (n==6 && strcmp(a,"--help")==0) {
      mcpl2phits_app_usage(argv,0);
      return -1;
    } else if (n>=1&&a[0]!='-') {
      if (*outphitsfile)
        return mcpl2phits_app_usage(argv,"Too many arguments.");
      else if (*inmcplfile) *outphitsfile = a;
      else *inmcplfile = a;
    } else {
      return mcpl2phits_app_usage(argv,"Bad arguments");
    }
  }

  if (!*inmcplfile)
    return mcpl2phits_app_usage(argv,"Missing argument : input MCPL file");
  if (!*outphitsfile)
    *outphitsfile = "phits.dmp";

  if (opt_num_limit<=0)
    opt_num_limit = 0;

  //NB: For now we allow unlimited number of particles in the file - but let the
  //mcpl2phits method emit a WARNING if exceeding INT32_MAX particles.
  *nparticles_limit = opt_num_limit;

  return 0;
}